

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O3

void fld_sq(limb_t *res,limb_t *x)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  
  lVar1 = *x;
  lVar17 = x[1];
  lVar6 = lVar17 * 2;
  lVar2 = x[2];
  lVar7 = lVar2 * 2;
  lVar3 = x[3];
  lVar4 = x[4];
  lVar13 = lVar3 * 0x13;
  lVar5 = lVar4 * 0x13;
  uVar9 = lVar13 * lVar7 + lVar5 * lVar6;
  uVar10 = uVar9 + lVar1 * lVar1;
  lVar19 = SUB168(SEXT816(lVar13) * SEXT816(lVar7),8) + SUB168(SEXT816(lVar5) * SEXT816(lVar6),8) +
           (ulong)CARRY8(lVar13 * lVar7,lVar5 * lVar6) + SUB168(SEXT816(lVar1) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar9,lVar1 * lVar1);
  uVar18 = lVar17 * lVar17 + lVar1 * lVar7;
  lVar8 = lVar3 * 2;
  uVar9 = lVar5 * lVar8 + uVar18;
  uVar21 = lVar6 * lVar2 + lVar1 * lVar8;
  uVar12 = lVar5 * lVar4 + uVar21;
  uVar11 = lVar1 * lVar4 * 2;
  uVar20 = lVar19 * 0x2000 | uVar10 >> 0x33;
  uVar14 = lVar13 * lVar3 + lVar5 * lVar7;
  uVar15 = uVar14 + lVar1 * lVar6;
  uVar16 = uVar15 + uVar20;
  lVar13 = SUB168(SEXT816(lVar13) * SEXT816(lVar3),8) + SUB168(SEXT816(lVar5) * SEXT816(lVar7),8) +
           (ulong)CARRY8(lVar13 * lVar3,lVar5 * lVar7) + SUB168(SEXT816(lVar1) * SEXT816(lVar6),8) +
           (ulong)CARRY8(uVar14,lVar1 * lVar6) + (lVar19 >> 0x33) + (ulong)CARRY8(uVar15,uVar20);
  uVar14 = lVar13 * 0x2000 | uVar16 >> 0x33;
  uVar15 = uVar14 + uVar9;
  lVar17 = (lVar13 >> 0x33) +
           SUB168(SEXT816(lVar5) * SEXT816(lVar8),8) +
           SUB168(SEXT816(lVar17) * SEXT816(lVar17),8) + SUB168(SEXT816(lVar1) * SEXT816(lVar7),8) +
           (ulong)CARRY8(lVar17 * lVar17,lVar1 * lVar7) + (ulong)CARRY8(lVar5 * lVar8,uVar18) +
           (ulong)CARRY8(uVar14,uVar9);
  uVar9 = lVar17 * 0x2000 | uVar15 >> 0x33;
  uVar18 = uVar9 + uVar12;
  lVar17 = (lVar17 >> 0x33) +
           SUB168(SEXT816(lVar5) * SEXT816(lVar4),8) +
           SUB168(SEXT816(lVar6) * SEXT816(lVar2),8) + SUB168(SEXT816(lVar1) * SEXT816(lVar8),8) +
           (ulong)CARRY8(lVar6 * lVar2,lVar1 * lVar8) + (ulong)CARRY8(lVar5 * lVar4,uVar21) +
           (ulong)CARRY8(uVar9,uVar12);
  uVar20 = lVar17 * 0x2000 | uVar18 >> 0x33;
  uVar9 = lVar2 * lVar2 + lVar3 * lVar6;
  uVar12 = uVar9 + uVar11;
  uVar14 = uVar12 + uVar20;
  uVar9 = ((SUB168(SEXT816(lVar2) * SEXT816(lVar2),8) + SUB168(SEXT816(lVar3) * SEXT816(lVar6),8) +
            (ulong)CARRY8(lVar2 * lVar2,lVar3 * lVar6) +
            SUB168(SEXT816(lVar1) * SEXT816(lVar4 * 2),8) + (ulong)CARRY8(uVar9,uVar11) +
            (lVar17 >> 0x33) + (ulong)CARRY8(uVar12,uVar20)) * 0x2000 | uVar14 >> 0x33) * 0x13 +
          (uVar10 & 0x7ffffffffffff);
  res[1] = (uVar16 & 0x7ffffffffffff) + ((long)uVar9 >> 0x33);
  *res = uVar9 & 0x7ffffffffffff;
  res[2] = uVar15 & 0x7ffffffffffff;
  res[3] = uVar18 & 0x7ffffffffffff;
  res[4] = uVar14 & 0x7ffffffffffff;
  return;
}

Assistant:

void
fld_sq(fld_t res, const fld_t x)
{
	limb_t x2_1, x2_2, x2_3, x2_4, x19_3, x19_4, tmp;
	llimb_t c[5];

	x2_1 = 2*x[1];
	x2_2 = 2*x[2];
	x2_3 = 2*x[3];
	x2_4 = 2*x[4];
	x19_3 = 19*x[3];
	x19_4 = 19*x[4];

	c[0] = (llimb_t)x[0]*x[0] + (llimb_t)x2_1*x19_4 + (llimb_t)x2_2*x19_3;
	c[1] = (llimb_t)x[0]*x2_1 + (llimb_t)x2_2*x19_4 + (llimb_t)x19_3*x[3];
	c[2] = (llimb_t)x[0]*x2_2 + (llimb_t)x[1]*x[1] + (llimb_t)x2_3*x19_4;
	c[3] = (llimb_t)x[0]*x2_3 + (llimb_t)x2_1*x[2] + (llimb_t)x19_4*x[4];
	c[4] = (llimb_t)x[0]*x2_4 + (llimb_t)x2_1*x[3] + (llimb_t)x[2]*x[2];

	c[1] += c[0] >> FLD_LIMB_BITS;
	c[2] += c[1] >> FLD_LIMB_BITS;
	c[3] += c[2] >> FLD_LIMB_BITS;
	c[4] += c[3] >> FLD_LIMB_BITS;

	tmp = (c[0] & FLD_LIMB_MASK) + 19*(c[4] >> FLD_LIMB_BITS);
	res[1] = (c[1] & FLD_LIMB_MASK) + (tmp >> FLD_LIMB_BITS);

	res[0] = tmp & FLD_LIMB_MASK;
	res[2] = c[2] & FLD_LIMB_MASK;
	res[3] = c[3] & FLD_LIMB_MASK;
	res[4] = c[4] & FLD_LIMB_MASK;
}